

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLDeclaration::ShallowClone(XMLDeclaration *this,XMLDocument *doc)

{
  char *str;
  XMLNode *pXVar1;
  XMLDeclaration *dec;
  XMLDocument *doc_local;
  XMLDeclaration *this_local;
  
  dec = (XMLDeclaration *)doc;
  if (doc == (XMLDocument *)0x0) {
    dec = (XMLDeclaration *)(this->super_XMLNode)._document;
  }
  str = XMLNode::Value(&this->super_XMLNode);
  pXVar1 = &XMLDocument::NewDeclaration((XMLDocument *)dec,str)->super_XMLNode;
  return pXVar1;
}

Assistant:

XMLNode* XMLDeclaration::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLDeclaration* dec = doc->NewDeclaration( Value() );	// fixme: this will always allocate memory. Intern?
    return dec;
}